

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

int __thiscall testing::internal::UnitTestImpl::successful_test_suite_count(UnitTestImpl *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer ppTVar4;
  
  ppTVar4 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar4 ==
      (this->test_suites_).
      super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      uVar2 = 0;
      if ((*ppTVar4)->should_run_ == true) {
        bVar1 = TestSuite::Passed(*ppTVar4);
        uVar2 = (uint)bVar1;
      }
      iVar3 = iVar3 + uVar2;
      ppTVar4 = ppTVar4 + 1;
    } while (ppTVar4 !=
             (this->test_suites_).
             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  return iVar3;
}

Assistant:

int UnitTestImpl::reportable_test_count() const {
  return SumOverTestSuiteList(test_suites_, &TestSuite::reportable_test_count);
}